

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackLog.cxx
# Opt level: O3

void __thiscall
cmCPackLog::Log(cmCPackLog *this,int tag,char *file,int line,char *msg,size_t length)

{
  byte bVar1;
  char cVar2;
  byte bVar3;
  size_t sVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  char *pcVar8;
  size_type sVar9;
  byte bVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  string tagString;
  byte local_7d;
  char *local_70;
  char *local_68;
  char local_60;
  undefined7 uStack_5f;
  int local_4c;
  char *local_48;
  size_t local_40;
  char *local_38;
  
  cVar2 = this->Debug;
  local_70 = &local_60;
  local_68 = (char *)0x0;
  local_60 = '\0';
  bVar12 = this->LogOutput != (ostream *)0x0;
  bVar13 = this->LastTag != tag;
  local_4c = line;
  local_48 = msg;
  local_40 = length;
  local_38 = file;
  if ((tag & 1U) != 0 && (bVar13 && bVar12)) {
    local_7d = 1;
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x510834);
  }
  else {
    local_7d = (byte)tag & 1;
  }
  bVar14 = (tag & 8U) != 0;
  bVar10 = local_7d;
  if (bVar14) {
    bVar10 = 1;
  }
  if (bVar14 && (bVar13 && bVar12)) {
    if (local_68 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      std::__cxx11::string::append((char *)&local_70);
      pcVar8 = local_68;
    }
    bVar10 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar8,0x4ffcd8);
  }
  bVar14 = (tag & 0x10U) == 0;
  bVar11 = 1;
  if (bVar14) {
    bVar11 = bVar10;
  }
  if (!bVar14 && (bVar13 && bVar12)) {
    if (local_68 == (char *)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      std::__cxx11::string::append((char *)&local_70);
      pcVar8 = local_68;
    }
    bVar11 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar8,0x547612);
  }
  if ((tag & 4U) == 0) {
    bVar10 = 0;
  }
  else {
    bVar10 = this->Debug;
    if ((bool)bVar10 != false) {
      bVar11 = 1;
      cVar2 = '\x01';
    }
    if ((bool)bVar10 == true && (bVar13 && bVar12)) {
      if (local_68 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        std::__cxx11::string::append((char *)&local_70);
        pcVar8 = local_68;
      }
      bVar10 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar8,0x4fad10);
      cVar2 = '\x01';
      bVar11 = 1;
    }
  }
  if ((tag & 2U) == 0) {
    bVar3 = 0;
  }
  else {
    bVar3 = this->Verbose;
    bVar1 = 1;
    if ((bool)bVar3 == false) {
      bVar1 = bVar11;
    }
    bVar11 = bVar1;
    if ((bool)bVar3 == true && (bVar13 && bVar12)) {
      if (local_68 == (char *)0x0) {
        pcVar8 = (char *)0x0;
      }
      else {
        std::__cxx11::string::append((char *)&local_70);
        pcVar8 = local_68;
      }
      bVar3 = 1;
      std::__cxx11::string::_M_replace((ulong)&local_70,0,pcVar8,0x510834);
      bVar11 = 1;
    }
  }
  bVar14 = this->Quiet;
  poVar5 = this->LogOutput;
  if (poVar5 != (ostream *)0x0) {
    if (bVar13 && bVar12) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"[",1);
      pcVar8 = local_38;
      if (local_38 == (char *)0x0) {
        std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
      }
      else {
        sVar4 = strlen(local_38);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_70,(long)local_68);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] ",2);
      poVar5 = this->LogOutput;
    }
    std::ostream::write((char *)poVar5,(long)local_48);
  }
  this->LastTag = tag;
  if ((bVar14 != false) || (bVar11 == 0)) goto LAB_00248796;
  if (this->NewLine == true) {
    sVar9 = (this->ErrorPrefix)._M_string_length;
    lVar6 = 0xd8;
    if (sVar9 == 0 || (tag & 0x10U) == 0) {
      sVar9 = (this->WarningPrefix)._M_string_length;
      if (sVar9 != 0 && (tag & 8U) != 0) {
        lVar7 = 0x90;
        goto LAB_0024861b;
      }
      sVar9 = (this->OutputPrefix)._M_string_length;
      lVar6 = 0xd0;
      if ((local_7d & sVar9 != 0) != 0) {
        lVar7 = 0x30;
        goto LAB_0024861b;
      }
      sVar9 = (this->VerbosePrefix)._M_string_length;
      if ((bVar3 & sVar9 != 0) != 0) {
        lVar7 = 0x50;
        goto LAB_0024861b;
      }
      sVar9 = (this->DebugPrefix)._M_string_length;
      if ((bVar10 & sVar9 != 0) != 0) {
        lVar7 = 0x70;
        goto LAB_0024861b;
      }
      sVar9 = (this->Prefix)._M_string_length;
      lVar7 = 0x10;
      if (sVar9 != 0) goto LAB_0024861b;
    }
    else {
      lVar7 = 0xb0;
LAB_0024861b:
      std::__ostream_insert<char,std::char_traits<char>>
                (*(ostream **)((long)&(this->super_cmObject)._vptr_cmObject + lVar6),
                 *(char **)((long)&(this->super_cmObject)._vptr_cmObject + lVar7),sVar9);
    }
    pcVar8 = local_38;
    if (cVar2 != '\0') {
      if ((tag & 0x18U) == 0) {
        poVar5 = this->DefaultOutput;
        if (local_38 == (char *)0x0) {
          std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
        }
        else {
          sVar4 = strlen(local_38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      }
      else {
        poVar5 = this->DefaultError;
        if (local_38 == (char *)0x0) {
          std::ios::clear((int)poVar5->_vptr_basic_ostream[-3] + (int)poVar5);
        }
        else {
          sVar4 = strlen(local_38);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar8,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      }
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_4c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    }
  }
  if ((tag & 0x18U) == 0) {
    std::ostream::write((char *)this->DefaultOutput,(long)local_48);
  }
  else {
    std::ostream::write((char *)this->DefaultError,(long)local_48);
  }
  std::ostream::flush();
  if ((2 < local_40) || (local_48[local_40 - 1] == '\n')) {
    this->NewLine = true;
  }
  if ((tag & 0x10U) != 0) {
    cmSystemTools::s_ErrorOccured = true;
  }
LAB_00248796:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void cmCPackLog::Log(int tag, const char* file, int line,
  const char* msg, size_t length)
{
  // By default no logging
  bool display = false;

  // Display file and line number if debug
  bool useFileAndLine = this->Debug;

  bool output  = false;
  bool debug   = false;
  bool warning = false;
  bool error   = false;
  bool verbose = false;

  // When writing in file, add list of tags whenever tag changes.
  std::string tagString;
  bool needTagString = false;
  if ( this->LogOutput && this->LastTag != tag )
    {
    needTagString = true;
    }

  if ( tag & LOG_OUTPUT )
    {
    output = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( tag & LOG_WARNING )
    {
    warning = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "WARNING";
      }
    }
  if ( tag & LOG_ERROR )
    {
    error = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "ERROR";
      }
    }
  if ( tag & LOG_DEBUG && this->Debug )
    {
    debug = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "DEBUG";
      }
    useFileAndLine = true;
    }
  if ( tag & LOG_VERBOSE && this->Verbose )
    {
    verbose = true;
    display = true;
    if ( needTagString )
      {
      if (!tagString.empty()) { tagString += ","; }
      tagString = "VERBOSE";
      }
    }
  if ( this->Quiet )
    {
    display = false;
    }
  if ( this->LogOutput )
    {
    if ( needTagString )
      {
      *this->LogOutput << "[" << file << ":" << line << " "
        << tagString << "] ";
      }
    this->LogOutput->write(msg, length);
    }
  this->LastTag = tag;
  if ( !display )
    {
    return;
    }
  if ( this->NewLine )
    {
    if ( error && !this->ErrorPrefix.empty() )
      {
      *this->DefaultError << this->ErrorPrefix;
      }
    else if ( warning && !this->WarningPrefix.empty() )
      {
      *this->DefaultError << this->WarningPrefix;
      }
    else if ( output && !this->OutputPrefix.empty() )
      {
      *this->DefaultOutput << this->OutputPrefix;
      }
    else if ( verbose && !this->VerbosePrefix.empty() )
      {
      *this->DefaultOutput << this->VerbosePrefix;
      }
    else if ( debug && !this->DebugPrefix.empty() )
      {
      *this->DefaultOutput << this->DebugPrefix;
      }
    else if ( !this->Prefix.empty() )
      {
      *this->DefaultOutput << this->Prefix;
      }
    if ( useFileAndLine )
      {
      if ( error || warning )
        {
        *this->DefaultError << file << ":" << line << " ";
        }
      else
        {
        *this->DefaultOutput << file << ":" << line << " ";
        }
      }
    }
  if ( error || warning )
    {
    this->DefaultError->write(msg, length);
    this->DefaultError->flush();
    }
  else
    {
    this->DefaultOutput->write(msg, length);
    this->DefaultOutput->flush();
    }
  if ( msg[length-1] == '\n' || length > 2 )
    {
    this->NewLine = true;
    }

  if ( error )
    {
    cmSystemTools::SetErrorOccured();
    }
}